

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O0

void ihevc_intra_pred_luma_horz_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  undefined1 (*pauVar1) [16];
  byte bVar2;
  byte bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  ushort uVar18;
  ushort uVar19;
  int iVar20;
  undefined8 *puVar21;
  int in_ECX;
  undefined8 *in_RDX;
  long in_RDI;
  int in_R8D;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  __m128i src_temp4_1;
  __m128i src_temp3_1;
  __m128i src_temp2_1;
  __m128i src_temp1_1;
  __m128i sm;
  __m128i src_temp16;
  __m128i src_temp15;
  __m128i src_temp14;
  __m128i src_temp13;
  __m128i src_temp12;
  __m128i src_temp11;
  __m128i src_temp10;
  __m128i src_temp9;
  __m128i src_temp8;
  __m128i src_temp7;
  __m128i src_temp6;
  __m128i src_temp5;
  __m128i src_temp4;
  __m128i src_temp3;
  __m128i src_temp2;
  __m128i src_temp1;
  WORD32 two_nt;
  WORD32 row;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  ulong local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  ulong local_f78;
  undefined8 uStack_f70;
  ulong local_f68;
  undefined8 uStack_f60;
  ulong local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  ulong uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  ulong uStack_ef0;
  undefined8 local_ee8;
  ulong uStack_ee0;
  undefined8 local_ed8;
  ulong uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  int local_eb0;
  short local_848;
  short sStack_846;
  short sStack_844;
  short sStack_842;
  short sStack_840;
  short sStack_83e;
  short sStack_83c;
  short sStack_83a;
  short local_828;
  short sStack_826;
  short sStack_824;
  short sStack_822;
  short sStack_820;
  short sStack_81e;
  short sStack_81c;
  short sStack_81a;
  ushort uStack_816;
  ushort uStack_814;
  ushort uStack_80e;
  ushort uStack_80c;
  short local_3b8;
  short sStack_3b6;
  short sStack_3b4;
  short sStack_3b2;
  short sStack_3b0;
  short sStack_3ae;
  short sStack_3ac;
  short sStack_3aa;
  ushort uStack_3a6;
  ushort uStack_3a4;
  ushort uStack_39e;
  ushort uStack_39c;
  short local_398;
  short sStack_396;
  short sStack_394;
  short sStack_392;
  short sStack_390;
  short sStack_38e;
  short sStack_38c;
  short sStack_38a;
  undefined1 local_318 [32];
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [32];
  undefined1 local_298 [32];
  undefined1 local_278 [32];
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [8];
  undefined1 local_1d0 [24];
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [24];
  undefined1 local_198 [8];
  undefined1 local_190 [24];
  undefined1 local_178 [8];
  undefined1 local_170 [24];
  undefined1 local_158 [8];
  undefined1 local_150 [24];
  undefined1 local_138 [8];
  undefined1 local_130 [24];
  undefined1 local_118 [8];
  undefined1 local_110 [24];
  undefined1 local_f8 [8];
  undefined1 local_f0 [24];
  undefined1 local_d8 [8];
  undefined1 local_d0 [24];
  undefined1 local_b8 [8];
  undefined1 local_b0 [24];
  undefined1 local_98 [8];
  undefined1 local_90 [24];
  undefined1 local_78 [8];
  undefined1 local_70 [20];
  int temp3;
  int temp2;
  int temp1;
  __m128i src_temp7_1;
  __m128i zero_8x16b;
  __m128i src_temp10_1;
  __m128i src_temp6_1;
  __m128i src_temp5_1;
  
  iVar20 = in_R8D * 2;
  if (in_R8D == 0x20) {
    for (local_eb0 = 0; local_eb0 < 0x20; local_eb0 = local_eb0 + 0x10) {
      pauVar1 = (undefined1 (*) [16])((~(long)local_eb0 - 0xfU) + in_RDI + iVar20);
      uVar16 = *(ulong *)(*pauVar1 + 8);
      auVar28 = *pauVar1;
      local_f38 = auVar28._7_8_;
      auVar17[8] = (char)(uVar16 >> 0x38);
      auVar17._0_8_ = local_f38;
      auVar17._9_7_ = 0;
      auVar22 = pshufb(auVar17,ZEXT816((ulong)0));
      local_f28 = auVar28._6_8_;
      auVar23._8_2_ = (short)(uVar16 >> 0x30);
      auVar23._0_8_ = local_f28;
      auVar23._10_6_ = 0;
      auVar23 = pshufb(auVar23,ZEXT816((ulong)0));
      local_f18 = auVar28._5_8_;
      uStack_f10 = uVar16 >> 0x28;
      auVar24._8_8_ = uStack_f10;
      auVar24._0_8_ = local_f18;
      auVar24 = pshufb(auVar24,ZEXT816((ulong)0));
      local_f08 = auVar28._4_8_;
      auVar25._8_4_ = (int)(uVar16 >> 0x20);
      auVar25._0_8_ = local_f08;
      auVar25._12_4_ = 0;
      auVar25 = pshufb(auVar25,ZEXT816((ulong)0));
      local_ef8 = auVar28._3_8_;
      uStack_ef0 = uVar16 >> 0x18;
      auVar26._8_8_ = uStack_ef0;
      auVar26._0_8_ = local_ef8;
      auVar26 = pshufb(auVar26,ZEXT816((ulong)0));
      local_ee8 = auVar28._2_8_;
      uStack_ee0 = uVar16 >> 0x10;
      auVar27._8_8_ = uStack_ee0;
      auVar27._0_8_ = local_ee8;
      auVar27 = pshufb(auVar27,ZEXT816((ulong)0));
      local_ed8 = auVar28._1_8_;
      uStack_ed0 = uVar16 >> 8;
      auVar29._8_8_ = uStack_ed0;
      auVar29._0_8_ = local_ed8;
      auVar28 = pshufb(auVar29,ZEXT816((ulong)0));
      auVar29 = pshufb(*pauVar1,ZEXT816((ulong)0));
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar16 >> 0x38;
      auVar30 = pshufb(auVar30,ZEXT816((ulong)0));
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar16 >> 0x30;
      auVar31 = pshufb(auVar31,ZEXT816((ulong)0));
      local_f98 = uVar16 >> 0x28;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_f98;
      auVar32 = pshufb(auVar32,ZEXT816((ulong)0));
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar16 >> 0x20;
      auVar33 = pshufb(auVar33,ZEXT816((ulong)0));
      local_f78 = uVar16 >> 0x18;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_f78;
      auVar34 = pshufb(auVar34,ZEXT816((ulong)0));
      local_f68 = uVar16 >> 0x10;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_f68;
      auVar35 = pshufb(auVar35,ZEXT816((ulong)0));
      local_f58 = uVar16 >> 8;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_f58;
      auVar36 = pshufb(auVar36,ZEXT816((ulong)0));
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar16;
      auVar37 = pshufb(auVar37,ZEXT816((ulong)0));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(local_eb0 * in_ECX));
      local_fb8 = auVar30._0_8_;
      uStack_fb0 = auVar30._8_8_;
      *puVar21 = local_fb8;
      puVar21[1] = uStack_fb0;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 1) * in_ECX));
      local_fa8 = auVar31._0_8_;
      uStack_fa0 = auVar31._8_8_;
      *puVar21 = local_fa8;
      puVar21[1] = uStack_fa0;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 2) * in_ECX));
      local_f98 = auVar32._0_8_;
      uStack_f90 = auVar32._8_8_;
      *puVar21 = local_f98;
      puVar21[1] = uStack_f90;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 3) * in_ECX));
      local_f88 = auVar33._0_8_;
      uStack_f80 = auVar33._8_8_;
      *puVar21 = local_f88;
      puVar21[1] = uStack_f80;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 4) * in_ECX));
      local_f78 = auVar34._0_8_;
      uStack_f70 = auVar34._8_8_;
      *puVar21 = local_f78;
      puVar21[1] = uStack_f70;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 5) * in_ECX));
      local_f68 = auVar35._0_8_;
      uStack_f60 = auVar35._8_8_;
      *puVar21 = local_f68;
      puVar21[1] = uStack_f60;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 6) * in_ECX));
      local_f58 = auVar36._0_8_;
      uStack_f50 = auVar36._8_8_;
      *puVar21 = local_f58;
      puVar21[1] = uStack_f50;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 7) * in_ECX));
      local_f48 = auVar37._0_8_;
      uStack_f40 = auVar37._8_8_;
      *puVar21 = local_f48;
      puVar21[1] = uStack_f40;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 8) * in_ECX));
      local_f38 = auVar22._0_8_;
      uStack_f30 = auVar22._8_8_;
      *puVar21 = local_f38;
      puVar21[1] = uStack_f30;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 9) * in_ECX));
      local_f28 = auVar23._0_8_;
      uStack_f20 = auVar23._8_8_;
      *puVar21 = local_f28;
      puVar21[1] = uStack_f20;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 10) * in_ECX));
      local_f18 = auVar24._0_8_;
      uStack_f10 = auVar24._8_8_;
      *puVar21 = local_f18;
      puVar21[1] = uStack_f10;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 0xb) * in_ECX));
      local_f08 = auVar25._0_8_;
      uStack_f00 = auVar25._8_8_;
      *puVar21 = local_f08;
      puVar21[1] = uStack_f00;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 0xc) * in_ECX));
      local_ef8 = auVar26._0_8_;
      uStack_ef0 = auVar26._8_8_;
      *puVar21 = local_ef8;
      puVar21[1] = uStack_ef0;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 0xd) * in_ECX));
      local_ee8 = auVar27._0_8_;
      uStack_ee0 = auVar27._8_8_;
      *puVar21 = local_ee8;
      puVar21[1] = uStack_ee0;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 0xe) * in_ECX));
      local_ed8 = auVar28._0_8_;
      uStack_ed0 = auVar28._8_8_;
      *puVar21 = local_ed8;
      puVar21[1] = uStack_ed0;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 0xf) * in_ECX));
      local_ec8 = auVar29._0_8_;
      uStack_ec0 = auVar29._8_8_;
      *puVar21 = local_ec8;
      puVar21[1] = uStack_ec0;
      puVar21 = (undefined8 *)((long)in_RDX + (long)(local_eb0 * in_ECX) + 0x10);
      *puVar21 = local_fb8;
      puVar21[1] = uStack_fb0;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 1) * in_ECX) + 0x10);
      *puVar21 = local_fa8;
      puVar21[1] = uStack_fa0;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 2) * in_ECX) + 0x10);
      *puVar21 = local_f98;
      puVar21[1] = uStack_f90;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 3) * in_ECX) + 0x10);
      *puVar21 = local_f88;
      puVar21[1] = uStack_f80;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 4) * in_ECX) + 0x10);
      *puVar21 = local_f78;
      puVar21[1] = uStack_f70;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 5) * in_ECX) + 0x10);
      *puVar21 = local_f68;
      puVar21[1] = uStack_f60;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 6) * in_ECX) + 0x10);
      *puVar21 = local_f58;
      puVar21[1] = uStack_f50;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 7) * in_ECX) + 0x10);
      *puVar21 = local_f48;
      puVar21[1] = uStack_f40;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 8) * in_ECX) + 0x10);
      *puVar21 = local_f38;
      puVar21[1] = uStack_f30;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 9) * in_ECX) + 0x10);
      *puVar21 = local_f28;
      puVar21[1] = uStack_f20;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 10) * in_ECX) + 0x10);
      *puVar21 = local_f18;
      puVar21[1] = uStack_f10;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 0xb) * in_ECX) + 0x10);
      *puVar21 = local_f08;
      puVar21[1] = uStack_f00;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 0xc) * in_ECX) + 0x10);
      *puVar21 = local_ef8;
      puVar21[1] = uStack_ef0;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 0xd) * in_ECX) + 0x10);
      *puVar21 = local_ee8;
      puVar21[1] = uStack_ee0;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 0xe) * in_ECX) + 0x10);
      *puVar21 = local_ed8;
      puVar21[1] = uStack_ed0;
      puVar21 = (undefined8 *)((long)in_RDX + (long)((local_eb0 + 0xf) * in_ECX) + 0x10);
      *puVar21 = local_ec8;
      puVar21[1] = uStack_ec0;
    }
  }
  else {
    bVar2 = *(byte *)(in_RDI + (iVar20 + -1));
    uVar18 = (ushort)bVar2;
    bVar3 = *(byte *)(in_RDI + iVar20);
    uVar19 = (ushort)bVar3;
    pauVar1 = (undefined1 (*) [16])(in_RDI + 1 + (long)iVar20);
    auVar28 = pmovzxbw(*pauVar1,*(undefined8 *)*pauVar1);
    local_398 = auVar28._0_2_;
    sStack_396 = auVar28._2_2_;
    sStack_394 = auVar28._4_2_;
    sStack_392 = auVar28._6_2_;
    sStack_390 = auVar28._8_2_;
    sStack_38e = auVar28._10_2_;
    sStack_38c = auVar28._12_2_;
    sStack_38a = auVar28._14_2_;
    uStack_3a6 = (ushort)bVar3;
    uStack_3a4 = (ushort)bVar3;
    uStack_39e = (ushort)bVar3;
    uStack_39c = (ushort)bVar3;
    local_ff8._0_4_ = CONCAT22(sStack_396 - uStack_3a6,local_398 - uVar19);
    local_ff8._0_6_ = CONCAT24(sStack_394 - uStack_3a4,(undefined4)local_ff8);
    local_ff8 = CONCAT26(sStack_392 - uVar19,(undefined6)local_ff8);
    uStack_ff0._0_2_ = sStack_390 - uVar19;
    uStack_ff0._2_2_ = sStack_38e - uStack_39e;
    uStack_ff0._4_2_ = sStack_38c - uStack_39c;
    uStack_ff0._6_2_ = sStack_38a - uVar19;
    auVar28._8_8_ = uStack_ff0;
    auVar28._0_8_ = local_ff8;
    auVar28 = psraw(auVar28,ZEXT416(1));
    uStack_816 = (ushort)bVar2;
    uStack_814 = (ushort)bVar2;
    uStack_80e = (ushort)bVar2;
    uStack_80c = (ushort)bVar2;
    local_828 = auVar28._0_2_;
    sStack_826 = auVar28._2_2_;
    sStack_824 = auVar28._4_2_;
    sStack_822 = auVar28._6_2_;
    sStack_820 = auVar28._8_2_;
    sStack_81e = auVar28._10_2_;
    sStack_81c = auVar28._12_2_;
    sStack_81a = auVar28._14_2_;
    local_828 = uVar18 + local_828;
    sStack_826 = uStack_816 + sStack_826;
    sStack_824 = uStack_814 + sStack_824;
    sStack_822 = uVar18 + sStack_822;
    sStack_820 = uVar18 + sStack_820;
    sStack_81e = uStack_80e + sStack_81e;
    sStack_81c = uStack_80c + sStack_81c;
    sStack_81a = uVar18 + sStack_81a;
    cVar12 = (char)local_828;
    cVar13 = (char)sStack_826;
    cVar14 = (char)sStack_824;
    cVar15 = (char)sStack_822;
    if (in_R8D == 4) {
      local_ff8._0_2_ =
           CONCAT11((0 < sStack_826) * (sStack_826 < 0x100) * cVar13 - (0xff < sStack_826),
                    (0 < local_828) * (local_828 < 0x100) * cVar12 - (0xff < local_828));
      local_ff8._0_3_ =
           CONCAT12((0 < sStack_824) * (sStack_824 < 0x100) * cVar14 - (0xff < sStack_824),
                    (undefined2)local_ff8);
      local_ff8._0_4_ =
           CONCAT13((0 < sStack_822) * (sStack_822 < 0x100) * cVar15 - (0xff < sStack_822),
                    (undefined3)local_ff8);
      *(undefined4 *)in_RDX = (undefined4)local_ff8;
      uVar4 = *(undefined1 *)(in_RDI + (iVar20 + -2));
      local_318._0_3_ = CONCAT21(CONCAT11(uVar4,uVar4),uVar4);
      uVar5 = *(undefined1 *)(in_RDI + (iVar20 + -3));
      local_2f8._0_3_ = CONCAT21(CONCAT11(uVar5,uVar5),uVar5);
      uVar6 = *(undefined1 *)(in_RDI + (iVar20 + -4));
      local_2d8._0_3_ = CONCAT21(CONCAT11(uVar6,uVar6),uVar6);
      *(uint *)((long)in_RDX + (long)in_ECX) = CONCAT13(uVar4,local_318._0_3_);
      *(uint *)((long)in_RDX + (long)(in_ECX << 1)) = CONCAT13(uVar5,local_2f8._0_3_);
      *(uint *)((long)in_RDX + (long)(in_ECX * 3)) = CONCAT13(uVar6,local_2d8._0_3_);
    }
    else if (in_R8D == 8) {
      local_1038._0_4_ =
           CONCAT13((0 < sStack_822) * (sStack_822 < 0x100) * cVar15 - (0xff < sStack_822),
                    CONCAT12((0 < sStack_824) * (sStack_824 < 0x100) * cVar14 - (0xff < sStack_824),
                             CONCAT11((0 < sStack_826) * (sStack_826 < 0x100) * cVar13 -
                                      (0xff < sStack_826),
                                      (0 < local_828) * (local_828 < 0x100) * cVar12 -
                                      (0xff < local_828))));
      local_1038._0_6_ =
           CONCAT15((0 < sStack_81e) * (sStack_81e < 0x100) * (char)sStack_81e - (0xff < sStack_81e)
                    ,CONCAT14((0 < sStack_820) * (sStack_820 < 0x100) * (char)sStack_820 -
                              (0xff < sStack_820),(undefined4)local_1038));
      local_1038 = CONCAT17((0 < sStack_81a) * (sStack_81a < 0x100) * (char)sStack_81a -
                            (0xff < sStack_81a),
                            CONCAT16((0 < sStack_81c) * (sStack_81c < 0x100) * (char)sStack_81c -
                                     (0xff < sStack_81c),(undefined6)local_1038));
      uVar4 = *(undefined1 *)(in_RDI + (iVar20 + -2));
      local_2b8._0_3_ = CONCAT21(CONCAT11(uVar4,uVar4),uVar4);
      uVar5 = *(undefined1 *)(in_RDI + (iVar20 + -3));
      local_298._0_3_ = CONCAT21(CONCAT11(uVar5,uVar5),uVar5);
      uVar6 = *(undefined1 *)(in_RDI + (iVar20 + -4));
      local_278._0_3_ = CONCAT21(CONCAT11(uVar6,uVar6),uVar6);
      uVar7 = *(undefined1 *)(in_RDI + (iVar20 + -5));
      local_258._0_3_ = CONCAT21(CONCAT11(uVar7,uVar7),uVar7);
      uVar8 = *(undefined1 *)(in_RDI + (iVar20 + -6));
      local_238._0_3_ = CONCAT21(CONCAT11(uVar8,uVar8),uVar8);
      uVar9 = *(undefined1 *)(in_RDI + (iVar20 + -7));
      local_218._0_3_ = CONCAT21(CONCAT11(uVar9,uVar9),uVar9);
      uVar10 = *(undefined1 *)(in_RDI + (iVar20 + -8));
      local_1f8._0_3_ = CONCAT21(CONCAT11(uVar10,uVar10),uVar10);
      *in_RDX = local_1038;
      *(ulong *)((long)in_RDX + (long)in_ECX) =
           CONCAT17(uVar4,CONCAT16(uVar4,CONCAT15(uVar4,CONCAT14(uVar4,CONCAT13(uVar4,local_2b8.
                                                                                      _0_3_)))));
      *(ulong *)((long)in_RDX + (long)(in_ECX * 2)) =
           CONCAT17(uVar5,CONCAT16(uVar5,CONCAT15(uVar5,CONCAT14(uVar5,CONCAT13(uVar5,local_298.
                                                                                      _0_3_)))));
      *(ulong *)((long)in_RDX + (long)(in_ECX * 3)) =
           CONCAT17(uVar6,CONCAT16(uVar6,CONCAT15(uVar6,CONCAT14(uVar6,CONCAT13(uVar6,local_278.
                                                                                      _0_3_)))));
      *(ulong *)((long)in_RDX + (long)(in_ECX << 2)) =
           CONCAT17(uVar7,CONCAT16(uVar7,CONCAT15(uVar7,CONCAT14(uVar7,CONCAT13(uVar7,local_258.
                                                                                      _0_3_)))));
      *(ulong *)((long)in_RDX + (long)(in_ECX * 5)) =
           CONCAT17(uVar8,CONCAT16(uVar8,CONCAT15(uVar8,CONCAT14(uVar8,CONCAT13(uVar8,local_238.
                                                                                      _0_3_)))));
      *(ulong *)((long)in_RDX + (long)(in_ECX * 6)) =
           CONCAT17(uVar9,CONCAT16(uVar9,CONCAT15(uVar9,CONCAT14(uVar9,CONCAT13(uVar9,local_218.
                                                                                      _0_3_)))));
      *(ulong *)((long)in_RDX + (long)(in_ECX * 7)) =
           CONCAT17(uVar10,CONCAT16(uVar10,CONCAT15(uVar10,CONCAT14(uVar10,CONCAT13(uVar10,local_1f8
                                                  ._0_3_)))));
    }
    else if (in_R8D == 0x10) {
      pauVar1 = (undefined1 (*) [16])(in_RDI + 9 + (long)iVar20);
      auVar28 = pmovzxbw(*pauVar1,*(undefined8 *)*pauVar1);
      local_3b8 = auVar28._0_2_;
      sStack_3b6 = auVar28._2_2_;
      sStack_3b4 = auVar28._4_2_;
      sStack_3b2 = auVar28._6_2_;
      sStack_3b0 = auVar28._8_2_;
      sStack_3ae = auVar28._10_2_;
      sStack_3ac = auVar28._12_2_;
      sStack_3aa = auVar28._14_2_;
      local_1038._0_4_ = CONCAT22(sStack_3b6 - uStack_3a6,local_3b8 - uVar19);
      local_1038._0_6_ = CONCAT24(sStack_3b4 - uStack_3a4,(undefined4)local_1038);
      local_1038 = CONCAT26(sStack_3b2 - uVar19,(undefined6)local_1038);
      uStack_1030._0_2_ = sStack_3b0 - uVar19;
      uStack_1030._2_2_ = sStack_3ae - uStack_39e;
      uStack_1030._4_2_ = sStack_3ac - uStack_39c;
      uStack_1030._6_2_ = sStack_3aa - uVar19;
      auVar22._8_8_ = uStack_1030;
      auVar22._0_8_ = local_1038;
      auVar28 = psraw(auVar22,ZEXT416(1));
      local_848 = auVar28._0_2_;
      sStack_846 = auVar28._2_2_;
      sStack_844 = auVar28._4_2_;
      sStack_842 = auVar28._6_2_;
      sStack_840 = auVar28._8_2_;
      sStack_83e = auVar28._10_2_;
      sStack_83c = auVar28._12_2_;
      sStack_83a = auVar28._14_2_;
      local_848 = uVar18 + local_848;
      sStack_846 = uStack_816 + sStack_846;
      sStack_844 = uStack_814 + sStack_844;
      sStack_842 = uVar18 + sStack_842;
      sStack_840 = uVar18 + sStack_840;
      sStack_83e = uStack_80e + sStack_83e;
      sStack_83c = uStack_80c + sStack_83c;
      sStack_83a = uVar18 + sStack_83a;
      local_ff8._0_2_ =
           CONCAT11((0 < sStack_826) * (sStack_826 < 0x100) * cVar13 - (0xff < sStack_826),
                    (0 < local_828) * (local_828 < 0x100) * cVar12 - (0xff < local_828));
      local_ff8._0_3_ =
           CONCAT12((0 < sStack_824) * (sStack_824 < 0x100) * cVar14 - (0xff < sStack_824),
                    (undefined2)local_ff8);
      local_ff8._0_4_ =
           CONCAT13((0 < sStack_822) * (sStack_822 < 0x100) * cVar15 - (0xff < sStack_822),
                    (undefined3)local_ff8);
      local_ff8._0_5_ =
           CONCAT14((0 < sStack_820) * (sStack_820 < 0x100) * (char)sStack_820 - (0xff < sStack_820)
                    ,(undefined4)local_ff8);
      local_ff8._0_6_ =
           CONCAT15((0 < sStack_81e) * (sStack_81e < 0x100) * (char)sStack_81e - (0xff < sStack_81e)
                    ,(undefined5)local_ff8);
      local_ff8._0_7_ =
           CONCAT16((0 < sStack_81c) * (sStack_81c < 0x100) * (char)sStack_81c - (0xff < sStack_81c)
                    ,(undefined6)local_ff8);
      local_ff8 = CONCAT17((0 < sStack_81a) * (sStack_81a < 0x100) * (char)sStack_81a -
                           (0xff < sStack_81a),(undefined7)local_ff8);
      uStack_ff0._0_1_ =
           (0 < local_848) * (local_848 < 0x100) * (char)local_848 - (0xff < local_848);
      uStack_ff0._1_1_ =
           (0 < sStack_846) * (sStack_846 < 0x100) * (char)sStack_846 - (0xff < sStack_846);
      uStack_ff0._2_1_ =
           (0 < sStack_844) * (sStack_844 < 0x100) * (char)sStack_844 - (0xff < sStack_844);
      uStack_ff0._3_1_ =
           (0 < sStack_842) * (sStack_842 < 0x100) * (char)sStack_842 - (0xff < sStack_842);
      uStack_ff0._4_1_ =
           (0 < sStack_840) * (sStack_840 < 0x100) * (char)sStack_840 - (0xff < sStack_840);
      uStack_ff0._5_1_ =
           (0 < sStack_83e) * (sStack_83e < 0x100) * (char)sStack_83e - (0xff < sStack_83e);
      uStack_ff0._6_1_ =
           (0 < sStack_83c) * (sStack_83c < 0x100) * (char)sStack_83c - (0xff < sStack_83c);
      uStack_ff0._7_1_ =
           (0 < sStack_83a) * (sStack_83a < 0x100) * (char)sStack_83a - (0xff < sStack_83a);
      *in_RDX = local_ff8;
      in_RDX[1] = uStack_ff0;
      uVar4 = *(undefined1 *)(in_RDI + (iVar20 + -2));
      local_1d0._0_3_ = CONCAT21(CONCAT11(uVar4,uVar4),uVar4);
      local_1d8._0_3_ = CONCAT21(CONCAT11(uVar4,uVar4),uVar4);
      uVar5 = *(undefined1 *)(in_RDI + (iVar20 + -3));
      local_1b0._0_3_ = CONCAT21(CONCAT11(uVar5,uVar5),uVar5);
      local_1b8._0_3_ = CONCAT21(CONCAT11(uVar5,uVar5),uVar5);
      uVar6 = *(undefined1 *)(in_RDI + (iVar20 + -4));
      local_190._0_3_ = CONCAT21(CONCAT11(uVar6,uVar6),uVar6);
      local_198._0_3_ = CONCAT21(CONCAT11(uVar6,uVar6),uVar6);
      uVar7 = *(undefined1 *)(in_RDI + (iVar20 + -5));
      local_170._0_3_ = CONCAT21(CONCAT11(uVar7,uVar7),uVar7);
      local_178._0_3_ = CONCAT21(CONCAT11(uVar7,uVar7),uVar7);
      uVar8 = *(undefined1 *)(in_RDI + (iVar20 + -6));
      local_150._0_3_ = CONCAT21(CONCAT11(uVar8,uVar8),uVar8);
      local_158._0_3_ = CONCAT21(CONCAT11(uVar8,uVar8),uVar8);
      uVar9 = *(undefined1 *)(in_RDI + (iVar20 + -7));
      local_130._0_3_ = CONCAT21(CONCAT11(uVar9,uVar9),uVar9);
      local_138._0_3_ = CONCAT21(CONCAT11(uVar9,uVar9),uVar9);
      uVar10 = *(undefined1 *)(in_RDI + (iVar20 + -8));
      local_110._0_3_ = CONCAT21(CONCAT11(uVar10,uVar10),uVar10);
      local_118._0_3_ = CONCAT21(CONCAT11(uVar10,uVar10),uVar10);
      uVar11 = *(undefined1 *)(in_RDI + (iVar20 + -9));
      local_f0._0_3_ = CONCAT21(CONCAT11(uVar11,uVar11),uVar11);
      local_f8._0_3_ = CONCAT21(CONCAT11(uVar11,uVar11),uVar11);
      *(undefined8 *)((long)in_RDX + (long)in_ECX) =
           CONCAT17(uVar4,CONCAT16(uVar4,CONCAT15(uVar4,CONCAT14(uVar4,CONCAT13(uVar4,local_1d8.
                                                                                      _0_3_)))));
      ((undefined8 *)((long)in_RDX + (long)in_ECX))[1] =
           CONCAT17(uVar4,CONCAT16(uVar4,CONCAT15(uVar4,CONCAT14(uVar4,CONCAT13(uVar4,local_1d0.
                                                                                      _0_3_)))));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 2));
      *puVar21 = CONCAT17(uVar5,CONCAT16(uVar5,CONCAT15(uVar5,CONCAT14(uVar5,CONCAT13(uVar5,
                                                  local_1b8._0_3_)))));
      puVar21[1] = CONCAT17(uVar5,CONCAT16(uVar5,CONCAT15(uVar5,CONCAT14(uVar5,CONCAT13(uVar5,
                                                  local_1b0._0_3_)))));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 3));
      *puVar21 = CONCAT17(uVar6,CONCAT16(uVar6,CONCAT15(uVar6,CONCAT14(uVar6,CONCAT13(uVar6,
                                                  local_198._0_3_)))));
      puVar21[1] = CONCAT17(uVar6,CONCAT16(uVar6,CONCAT15(uVar6,CONCAT14(uVar6,CONCAT13(uVar6,
                                                  local_190._0_3_)))));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX << 2));
      *puVar21 = CONCAT17(uVar7,CONCAT16(uVar7,CONCAT15(uVar7,CONCAT14(uVar7,CONCAT13(uVar7,
                                                  local_178._0_3_)))));
      puVar21[1] = CONCAT17(uVar7,CONCAT16(uVar7,CONCAT15(uVar7,CONCAT14(uVar7,CONCAT13(uVar7,
                                                  local_170._0_3_)))));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 5));
      *puVar21 = CONCAT17(uVar8,CONCAT16(uVar8,CONCAT15(uVar8,CONCAT14(uVar8,CONCAT13(uVar8,
                                                  local_158._0_3_)))));
      puVar21[1] = CONCAT17(uVar8,CONCAT16(uVar8,CONCAT15(uVar8,CONCAT14(uVar8,CONCAT13(uVar8,
                                                  local_150._0_3_)))));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 6));
      *puVar21 = CONCAT17(uVar9,CONCAT16(uVar9,CONCAT15(uVar9,CONCAT14(uVar9,CONCAT13(uVar9,
                                                  local_138._0_3_)))));
      puVar21[1] = CONCAT17(uVar9,CONCAT16(uVar9,CONCAT15(uVar9,CONCAT14(uVar9,CONCAT13(uVar9,
                                                  local_130._0_3_)))));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 7));
      *puVar21 = CONCAT17(uVar10,CONCAT16(uVar10,CONCAT15(uVar10,CONCAT14(uVar10,CONCAT13(uVar10,
                                                  local_118._0_3_)))));
      puVar21[1] = CONCAT17(uVar10,CONCAT16(uVar10,CONCAT15(uVar10,CONCAT14(uVar10,CONCAT13(uVar10,
                                                  local_110._0_3_)))));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX << 3));
      *puVar21 = CONCAT17(uVar11,CONCAT16(uVar11,CONCAT15(uVar11,CONCAT14(uVar11,CONCAT13(uVar11,
                                                  local_f8._0_3_)))));
      puVar21[1] = CONCAT17(uVar11,CONCAT16(uVar11,CONCAT15(uVar11,CONCAT14(uVar11,CONCAT13(uVar11,
                                                  local_f0._0_3_)))));
      uVar4 = *(undefined1 *)(in_RDI + (iVar20 + -10));
      local_d0._0_3_ = CONCAT21(CONCAT11(uVar4,uVar4),uVar4);
      local_d8._0_3_ = CONCAT21(CONCAT11(uVar4,uVar4),uVar4);
      uVar5 = *(undefined1 *)(in_RDI + (iVar20 + -0xb));
      local_b0._0_3_ = CONCAT21(CONCAT11(uVar5,uVar5),uVar5);
      local_b8._0_3_ = CONCAT21(CONCAT11(uVar5,uVar5),uVar5);
      uVar6 = *(undefined1 *)(in_RDI + (iVar20 + -0xc));
      local_90._0_3_ = CONCAT21(CONCAT11(uVar6,uVar6),uVar6);
      local_98._0_3_ = CONCAT21(CONCAT11(uVar6,uVar6),uVar6);
      uVar7 = *(undefined1 *)(in_RDI + (iVar20 + -0xd));
      local_70._0_3_ = CONCAT21(CONCAT11(uVar7,uVar7),uVar7);
      local_78._0_3_ = CONCAT21(CONCAT11(uVar7,uVar7),uVar7);
      uVar8 = *(undefined1 *)(in_RDI + (iVar20 + -0xe));
      src_temp7_1[0]._0_3_ = CONCAT21(CONCAT11(uVar8,uVar8),uVar8);
      temp2._0_3_ = CONCAT21(CONCAT11(uVar8,uVar8),uVar8);
      uVar9 = *(undefined1 *)(in_RDI + (iVar20 + -0xf));
      src_temp10_1[0]._0_3_ = CONCAT21(CONCAT11(uVar9,uVar9),uVar9);
      zero_8x16b[1]._0_3_ = CONCAT21(CONCAT11(uVar9,uVar9),uVar9);
      uVar10 = *(undefined1 *)(in_RDI + (iVar20 + -0x10));
      src_temp5_1[1]._0_3_ = CONCAT21(CONCAT11(uVar10,uVar10),uVar10);
      src_temp5_1[0]._0_3_ = CONCAT21(CONCAT11(uVar10,uVar10),uVar10);
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 9));
      *puVar21 = CONCAT17(uVar4,CONCAT16(uVar4,CONCAT15(uVar4,CONCAT14(uVar4,CONCAT13(uVar4,local_d8
                                                  ._0_3_)))));
      puVar21[1] = CONCAT17(uVar4,CONCAT16(uVar4,CONCAT15(uVar4,CONCAT14(uVar4,CONCAT13(uVar4,
                                                  local_d0._0_3_)))));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 10));
      *puVar21 = CONCAT17(uVar5,CONCAT16(uVar5,CONCAT15(uVar5,CONCAT14(uVar5,CONCAT13(uVar5,local_b8
                                                  ._0_3_)))));
      puVar21[1] = CONCAT17(uVar5,CONCAT16(uVar5,CONCAT15(uVar5,CONCAT14(uVar5,CONCAT13(uVar5,
                                                  local_b0._0_3_)))));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xb));
      *puVar21 = CONCAT17(uVar6,CONCAT16(uVar6,CONCAT15(uVar6,CONCAT14(uVar6,CONCAT13(uVar6,local_98
                                                  ._0_3_)))));
      puVar21[1] = CONCAT17(uVar6,CONCAT16(uVar6,CONCAT15(uVar6,CONCAT14(uVar6,CONCAT13(uVar6,
                                                  local_90._0_3_)))));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xc));
      *puVar21 = CONCAT17(uVar7,CONCAT16(uVar7,CONCAT15(uVar7,CONCAT14(uVar7,CONCAT13(uVar7,local_78
                                                  ._0_3_)))));
      puVar21[1] = CONCAT17(uVar7,CONCAT16(uVar7,CONCAT15(uVar7,CONCAT14(uVar7,CONCAT13(uVar7,
                                                  local_70._0_3_)))));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xd));
      *puVar21 = CONCAT17(uVar8,CONCAT16(uVar8,CONCAT15(uVar8,CONCAT14(uVar8,CONCAT13(uVar8,(
                                                  undefined3)temp2)))));
      puVar21[1] = CONCAT17(uVar8,CONCAT16(uVar8,CONCAT15(uVar8,CONCAT14(uVar8,CONCAT13(uVar8,(
                                                  undefined3)src_temp7_1[0])))));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xe));
      *puVar21 = CONCAT17(uVar9,CONCAT16(uVar9,CONCAT15(uVar9,CONCAT14(uVar9,CONCAT13(uVar9,(
                                                  undefined3)zero_8x16b[1])))));
      puVar21[1] = CONCAT17(uVar9,CONCAT16(uVar9,CONCAT15(uVar9,CONCAT14(uVar9,CONCAT13(uVar9,(
                                                  undefined3)src_temp10_1[0])))));
      puVar21 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 0xf));
      *puVar21 = CONCAT17(uVar10,CONCAT16(uVar10,CONCAT15(uVar10,CONCAT14(uVar10,CONCAT13(uVar10,(
                                                  undefined3)src_temp5_1[0])))));
      puVar21[1] = CONCAT17(uVar10,CONCAT16(uVar10,CONCAT15(uVar10,CONCAT14(uVar10,CONCAT13(uVar10,(
                                                  undefined3)src_temp5_1[1])))));
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_horz_sse42(UWORD8 *pu1_ref,
                                      WORD32 src_strd,
                                      UWORD8 *pu1_dst,
                                      WORD32 dst_strd,
                                      WORD32 nt,
                                      WORD32 mode)
{

    WORD32 row;
    WORD32 two_nt;
    UNUSED(src_strd);
    UNUSED(mode);

    two_nt = 2 * nt;


    if(nt == 32)
    {
        __m128i src_temp1, src_temp2, src_temp3, src_temp4, src_temp5, src_temp6, src_temp7, src_temp8;
        __m128i src_temp9, src_temp10, src_temp11, src_temp12, src_temp13, src_temp14, src_temp15, src_temp16;
        __m128i sm = _mm_loadu_si128((__m128i *)&IHEVCE_SHUFFLEMASK4[0]);

        for(row = 0; row < nt; row += 16)
        {
            {
                src_temp1 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 1 - row - 15));

                src_temp2 =  _mm_srli_si128(src_temp1, 1);
                src_temp3 =  _mm_srli_si128(src_temp1, 2);
                src_temp4 =  _mm_srli_si128(src_temp1, 3);
                src_temp5 =  _mm_srli_si128(src_temp1, 4);
                src_temp6 =  _mm_srli_si128(src_temp1, 5);
                src_temp7 =  _mm_srli_si128(src_temp1, 6);
                src_temp8 =  _mm_srli_si128(src_temp1, 7);

                src_temp9 =  _mm_srli_si128(src_temp1, 8);
                src_temp10 =  _mm_srli_si128(src_temp1, 9);
                src_temp11 =  _mm_srli_si128(src_temp1, 10);
                src_temp12 =  _mm_srli_si128(src_temp1, 11);
                src_temp13 =  _mm_srli_si128(src_temp1, 12);
                src_temp14 =  _mm_srli_si128(src_temp1, 13);
                src_temp15 =  _mm_srli_si128(src_temp1, 14);
                src_temp16 =  _mm_srli_si128(src_temp1, 15);

                src_temp8 =  _mm_shuffle_epi8(src_temp8, sm);
                src_temp7 =  _mm_shuffle_epi8(src_temp7, sm);
                src_temp6 =  _mm_shuffle_epi8(src_temp6, sm);
                src_temp5 =  _mm_shuffle_epi8(src_temp5, sm);
                src_temp4 =  _mm_shuffle_epi8(src_temp4, sm);
                src_temp3 =  _mm_shuffle_epi8(src_temp3, sm);
                src_temp2 =  _mm_shuffle_epi8(src_temp2, sm);
                src_temp1 =  _mm_shuffle_epi8(src_temp1, sm);

                src_temp16 =  _mm_shuffle_epi8(src_temp16, sm);
                src_temp15 =  _mm_shuffle_epi8(src_temp15, sm);
                src_temp14 =  _mm_shuffle_epi8(src_temp14, sm);
                src_temp13 =  _mm_shuffle_epi8(src_temp13, sm);
                src_temp12 =  _mm_shuffle_epi8(src_temp12, sm);
                src_temp11 =  _mm_shuffle_epi8(src_temp11, sm);
                src_temp10 =  _mm_shuffle_epi8(src_temp10, sm);
                src_temp9 =  _mm_shuffle_epi8(src_temp9, sm);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), src_temp16);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp13);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp12);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp10);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 7) * dst_strd)), src_temp9);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 8) * dst_strd)), src_temp8);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 9) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 10) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 11) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 12) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 13) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 14) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 15) * dst_strd)), src_temp1);

                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 0) * dst_strd)), src_temp16);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 1) * dst_strd)), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 2) * dst_strd)), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 3) * dst_strd)), src_temp13);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 4) * dst_strd)), src_temp12);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 5) * dst_strd)), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 6) * dst_strd)), src_temp10);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 7) * dst_strd)), src_temp9);

                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 8) * dst_strd)), src_temp8);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 9) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 10) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 11) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 12) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 13) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 14) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 15) * dst_strd)), src_temp1);

            }

        }

    }
    else

    {
        __m128i src_temp1, src_temp2, src_temp3, src_temp4, src_temp5, src_temp6;
        __m128i src_temp10, zero_8x16b, src_temp7;

        /* DC filtering for the first top row and first left column */

        zero_8x16b = _mm_set1_epi16(0);

        /*Filtering done for the 1st row */

        src_temp2 =  _mm_set1_epi16(pu1_ref[two_nt - 1]);
        src_temp10 =  _mm_set1_epi16(pu1_ref[two_nt]);

        /*  loding 8-bit 16 pixels */
        src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

        src_temp4 =  _mm_cvtepu8_epi16(src_temp4);

        /*(pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt])*/
        src_temp3 = _mm_sub_epi16(src_temp4, src_temp10);

        /* ((pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt]) >> 1)*/
        src_temp3 = _mm_srai_epi16(src_temp3, 1);

        /* pu1_ref[two_nt - 1]+((pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt]) >> 1)*/
        src_temp3 = _mm_add_epi16(src_temp2, src_temp3);

        if(nt == 4)
        {
            int temp1, temp2, temp3;
            src_temp3 = _mm_packus_epi16(src_temp3, zero_8x16b);
            temp1 = _mm_cvtsi128_si32(src_temp3);

            *(WORD32 *)(&pu1_dst[0]) = temp1;

            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 2]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 3]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 4]);

            temp1 = _mm_cvtsi128_si32(src_temp2);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp4);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp3;

        }
        else if(nt == 8)
        {
            src_temp10 = _mm_packus_epi16(src_temp3, zero_8x16b);


            src_temp1 =  _mm_set1_epi8(pu1_ref[two_nt - 2]);
            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 3]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 4]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 5]);
            src_temp5 =  _mm_set1_epi8(pu1_ref[two_nt - 6]);
            src_temp6 =  _mm_set1_epi8(pu1_ref[two_nt - 7]);
            src_temp7 =  _mm_set1_epi8(pu1_ref[two_nt - 8]);

            _mm_storel_epi64((__m128i *)(pu1_dst), src_temp10);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            _mm_storel_epi64((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + (4 * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + (5 * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + (6 * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + (7 * dst_strd)), src_temp7);

        }
        else if(nt == 16)
        {
            src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 8));
            src_temp4 =  _mm_cvtepu8_epi16(src_temp4);

            src_temp10 = _mm_sub_epi16(src_temp4, src_temp10);
            src_temp10 = _mm_srai_epi16(src_temp10, 1);
            src_temp10 = _mm_add_epi16(src_temp2, src_temp10);

            src_temp3 = _mm_packus_epi16(src_temp3, src_temp10);
            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp3);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            src_temp1 =  _mm_set1_epi8(pu1_ref[two_nt - 2]);
            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 3]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 4]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 5]);
            src_temp5 =  _mm_set1_epi8(pu1_ref[two_nt - 6]);
            src_temp6 =  _mm_set1_epi8(pu1_ref[two_nt - 7]);
            src_temp7 =  _mm_set1_epi8(pu1_ref[two_nt - 8]);
            src_temp10 =  _mm_set1_epi8(pu1_ref[two_nt - 9]);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), src_temp10);

            src_temp1 =  _mm_set1_epi8(pu1_ref[two_nt - 10]);
            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 11]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 12]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 13]);
            src_temp5 =  _mm_set1_epi8(pu1_ref[two_nt - 14]);
            src_temp6 =  _mm_set1_epi8(pu1_ref[two_nt - 15]);
            src_temp7 =  _mm_set1_epi8(pu1_ref[two_nt - 16]);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), src_temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), src_temp5);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), src_temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), src_temp7);

        }
    }
}